

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::BamFtp::ConnectCommandSocket(BamFtp *this)

{
  bool bVar1;
  char __rhs;
  long *in_RDI;
  OpenMode unaff_retaddr;
  uint16_t unaff_retaddr_00;
  string *in_stack_00000008;
  TcpSocket *in_stack_00000010;
  string typeCommand;
  string passwordCommand;
  string userCommand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178 [24];
  undefined8 in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  IBamIODevice *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8 [23];
  undefined1 in_stack_ffffffffffffff1f;
  undefined8 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  string local_d0 [8];
  BamFtp *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [47];
  byte local_1;
  
  bamtools_noop();
  bVar1 = TcpSocket::ConnectToHost
                    (in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
  if (bVar1) {
    bVar1 = ReceiveReply(in_stack_ffffffffffffff38);
    if (bVar1) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     USER_CMD_abi_cxx11_,' ');
      std::operator+(&local_b0,__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (in_RDI + 0x16));
      std::operator+(&local_90,&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FTP_NEWLINE_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string(local_d0);
      __rhs = SendCommand((BamFtp *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                          (string *)in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
      if ((bool)__rhs) {
        std::operator+(&local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       PASS_CMD_abi_cxx11_,' ');
        std::operator+(&local_118,&local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (in_RDI + 0x1a));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                       ,&local_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       FTP_NEWLINE_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_138);
        bVar1 = SendCommand((BamFtp *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                            (string *)in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
        if (bVar1) {
          std::operator+(&local_198,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         TYPE_CMD_abi_cxx11_,' ');
          std::operator+(__return_storage_ptr__,__rhs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffea8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_178,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         FTP_NEWLINE_abi_cxx11_);
          std::__cxx11::string::~string(local_178);
          std::__cxx11::string::~string((string *)&local_198);
          local_1 = SendCommand((BamFtp *)
                                CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                (string *)in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f)
          ;
          if (!(bool)local_1) {
            (**(code **)(*in_RDI + 0x10))();
          }
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
        }
        else {
          (**(code **)(*in_RDI + 0x10))();
          local_1 = 0;
        }
        std::__cxx11::string::~string(local_f8);
      }
      else {
        (**(code **)(*in_RDI + 0x10))();
        local_1 = 0;
      }
      std::__cxx11::string::~string((string *)&local_90);
    }
    else {
      (**(code **)(*in_RDI + 0x10))();
      local_1 = 0;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"BamFtp::ConnectCommandSocket",&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"could not connect to host - ",&local_69);
    IBamIODevice::SetErrorString
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (string *)in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool BamFtp::ConnectCommandSocket()
{

    BT_ASSERT_X(m_commandSocket, "null command socket?");

    // connect to FTP server
    if (!m_commandSocket->ConnectToHost(m_hostname, m_port, m_mode)) {
        SetErrorString("BamFtp::ConnectCommandSocket", "could not connect to host - ");
        return false;
    }

    // receive initial reply from host
    if (!ReceiveReply()) {
        Close();
        return false;
    }

    // send USER command
    std::string userCommand = USER_CMD + CMD_SEPARATOR + m_username + FTP_NEWLINE;
    if (!SendCommand(userCommand, true)) {
        Close();
        return false;
    }

    // send PASS command
    std::string passwordCommand = PASS_CMD + CMD_SEPARATOR + m_password + FTP_NEWLINE;
    if (!SendCommand(passwordCommand, true)) {
        Close();
        return false;
    }

    // send TYPE command
    std::string typeCommand = TYPE_CMD + CMD_SEPARATOR + 'I' + FTP_NEWLINE;
    if (!SendCommand(typeCommand, true)) {
        Close();
        return false;
    }

    // return success
    return true;
}